

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall annealing::print(annealing *this)

{
  ostream *poVar1;
  annealing *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"STEP: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->step_num);
  poVar1 = std::operator<<(poVar1," ENERGY: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->old_energy);
  poVar1 = std::operator<<(poVar1," TEMPERATURE: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->temperature);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print() {
        std::cout << "STEP: " << step_num <<" ENERGY: " << old_energy << " TEMPERATURE: " << temperature << std::endl;
    }